

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
::erase_meta_only(raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
                  *this,const_iterator it)

{
  bool bVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  size_t i;
  size_t *psVar5;
  ctrl_t *pos;
  ctrl_t local_81;
  undefined1 local_68 [7];
  bool was_never_full;
  BitMask<unsigned_int,_16,_0> local_4c;
  undefined1 local_48 [4];
  BitMask<unsigned_int,_16,_0> empty_before;
  BitMask<unsigned_int,_16,_0> local_34;
  ulong uStack_30;
  BitMask<unsigned_int,_16,_0> empty_after;
  size_t index_before;
  size_t index;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  *this_local;
  const_iterator it_local;
  
  pos = it.inner_.ctrl_;
  bVar1 = IsFull(*pos);
  if (bVar1) {
    this->size_ = this->size_ - 1;
    i = (long)pos - (long)this->ctrl_;
    uStack_30 = i - 0x10 & this->capacity_;
    GroupSse2Impl::GroupSse2Impl((GroupSse2Impl *)local_48,pos);
    local_34 = GroupSse2Impl::MatchEmpty((GroupSse2Impl *)local_48);
    GroupSse2Impl::GroupSse2Impl((GroupSse2Impl *)local_68,this->ctrl_ + uStack_30);
    local_4c = GroupSse2Impl::MatchEmpty((GroupSse2Impl *)local_68);
    bVar2 = BitMask::operator_cast_to_bool((BitMask *)&local_4c);
    bVar1 = false;
    if (bVar2) {
      bVar2 = BitMask::operator_cast_to_bool((BitMask *)&local_34);
      bVar1 = false;
      if (bVar2) {
        uVar3 = BitMask<unsigned_int,_16,_0>::TrailingZeros(&local_34);
        uVar4 = BitMask<unsigned_int,_16,_0>::LeadingZeros(&local_4c);
        bVar1 = uVar3 + uVar4 < 0x10;
      }
    }
    local_81 = -0x80;
    if (!bVar1) {
      local_81 = -2;
    }
    set_ctrl(this,i,local_81);
    psVar5 = growth_left(this);
    *psVar5 = (ulong)bVar1 + *psVar5;
    HashtablezInfoHandle::RecordErase((HashtablezInfoHandle *)&this->field_0x20);
    return;
  }
  __assert_fail("IsFull(*it.inner_.ctrl_) && \"erasing a dangling iterator\"",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                ,0x7c8,
                "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<int>, phmap::priv::StatefulTestingHash, phmap::priv::StatefulTestingEqual, phmap::priv::Alloc<>>::erase_meta_only(const_iterator) [Policy = phmap::priv::FlatHashSetPolicy<int>, Hash = phmap::priv::StatefulTestingHash, Eq = phmap::priv::StatefulTestingEqual, Alloc = phmap::priv::Alloc<>]"
               );
}

Assistant:

void erase_meta_only(const_iterator it) {
        assert(IsFull(*it.inner_.ctrl_) && "erasing a dangling iterator");
        --size_;
        const size_t index = (size_t)(it.inner_.ctrl_ - ctrl_);
        const size_t index_before = (index - Group::kWidth) & capacity_;
        const auto empty_after = Group(it.inner_.ctrl_).MatchEmpty();
        const auto empty_before = Group(ctrl_ + index_before).MatchEmpty();

        // We count how many consecutive non empties we have to the right and to the
        // left of `it`. If the sum is >= kWidth then there is at least one probe
        // window that might have seen a full group.
        bool was_never_full =
            empty_before && empty_after &&
            static_cast<size_t>(empty_after.TrailingZeros() +
                                empty_before.LeadingZeros()) < Group::kWidth;

        set_ctrl(index, was_never_full ? kEmpty : kDeleted);
        growth_left() += was_never_full;
        infoz_.RecordErase();
    }